

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O0

GLuint a__GLCreateShader(int type,char **source)

{
  int local_24;
  GLuint local_20;
  GLint status;
  GLuint shader;
  int n;
  char **source_local;
  int type_local;
  
  _shader = source;
  source_local._4_4_ = type;
  local_20 = glCreateShader(type);
  for (status = 0; _shader[status] != (char *)0x0; status = status + 1) {
  }
  glShaderSource(local_20,status,_shader,0);
  glCompileShader(local_20);
  glGetShaderiv(local_20,0x8b81,&local_24);
  if (local_24 != 1) {
    glGetShaderInfoLog(local_20,0x400,0,a_gl_error);
    glDeleteShader(local_20);
    local_20 = 0;
  }
  return local_20;
}

Assistant:

static GLuint a__GLCreateShader(int type, const char *const *source) {
	int n;
	GLuint shader = glCreateShader(type);

	for (n = 0; source[n] != 0; ++n)
		;

	AGL__CALL(glShaderSource(shader, n, (const GLchar **)source, 0));
	AGL__CALL(glCompileShader(shader));

	{
		GLint status;
		AGL__CALL(glGetShaderiv(shader, GL_COMPILE_STATUS, &status));
		if (status != GL_TRUE) {
			AGL__CALL(glGetShaderInfoLog(shader, sizeof(a_gl_error), 0, a_gl_error));
			AGL__CALL(glDeleteShader(shader));
			shader = 0;
		}
	}

	return shader;
}